

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void __thiscall
Assimp::FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>
          (Node *this,string *name,FBXExportProperty *more)

{
  Node c;
  FBXExportProperty local_a0;
  undefined1 local_80 [112];
  
  Node((Node *)local_80,name);
  FBX::FBXExportProperty::FBXExportProperty(&local_a0,more);
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<Assimp::FBX::FBXExportProperty&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)(local_80 + 0x20),&local_a0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_a0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_80);
  ~Node((Node *)local_80);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }